

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

bool __thiscall
xscript::parser::ast::parse_throw_statement
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  bool bVar1;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  string *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  initializer_list<xscript::tokenizer::token_t> __l;
  _Rb_tree<xscript::tokenizer::token_t,_xscript::tokenizer::token_t,_std::_Identity<xscript::tokenizer::token_t>,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
  local_c0;
  string local_90;
  string local_70;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  less<xscript::tokenizer::token_t> local_1b;
  allocator_type local_1a;
  allocator<char> local_19;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,THROW_STATEMENT);
  if ((this->cur_token).type == TK_THROW) {
    next(this);
    bVar1 = parse_expression(this,parent_00);
    if (bVar1) {
      if ((this->cur_token).type == TK_SEMICOLON) {
        next(this);
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_19);
      local_30._M_len = 0x22;
      local_30._M_str = "\';\' expected after throw statement";
      args_00._M_len = 1;
      args_00._M_array = &local_30;
      append_syntax_error(this,&local_50,0x386,args_00);
      this_00 = &local_50;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_19);
      local_30._M_len = CONCAT44(local_30._M_len._4_4_,0x37);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_30;
      std::
      set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::set((set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
             *)&local_c0,__l,&local_1b,&local_1a);
      process_failover(this,&local_70,0x382,
                       (set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
                        *)&local_c0,true);
      std::
      _Rb_tree<xscript::tokenizer::token_t,_xscript::tokenizer::token_t,_std::_Identity<xscript::tokenizer::token_t>,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::~_Rb_tree(&local_c0);
      this_00 = &local_70;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_19);
    local_30._M_len = 0x10;
    local_30._M_str = "\'throw\' expected";
    args._M_len = 1;
    args._M_array = &local_30;
    process_failover(this,&local_90,0x37d,args,true);
    this_00 = &local_90;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool ast::parse_throw_statement(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(THROW_STATEMENT);

    if (cur_token != tokenizer::TK_THROW) {
        return failover({"'throw' expected"});
    }
    next();

    if (!parse_expression(node)) {
        return failover({tokenizer::TK_SEMICOLON});
    }

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"';' expected after throw statement"});
    }
    next();

    return true;
}